

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O2

size_t HUF_compress_internal
                 (void *dst,size_t dstSize,void *src,size_t srcSize,uint maxSymbolValue,uint huffLog
                 ,HUF_nbStreams_e nbStreams,void *workSpace,size_t wkspSize,HUF_CElt *oldHufTable,
                 HUF_repeat *repeat,int preferRepeat,int bmi2)

{
  byte bVar1;
  bool bVar2;
  HUF_repeat HVar3;
  uint uVar4;
  size_t sVar5;
  ulong uVar6;
  size_t sVar7;
  long lVar8;
  BYTE *pBVar9;
  size_t _var_err__;
  HUF_CElt *pHVar10;
  uint maxSymbolValue_local;
  ulong local_48;
  HUF_CElt *local_40;
  BYTE *local_38;
  
  if (((ulong)workSpace & 3) != 0) {
    return 0xffffffffffffffff;
  }
  if (wkspSize < 0x1800) {
    return 0xffffffffffffffbe;
  }
  if (dstSize == 0 || srcSize == 0) {
    return 0;
  }
  if (0x20000 < srcSize) {
    return 0xffffffffffffffb8;
  }
  if (0xc < huffLog) {
    return 0xffffffffffffffd4;
  }
  if (0xff < maxSymbolValue) {
    return 0xffffffffffffffd2;
  }
  maxSymbolValue_local = maxSymbolValue;
  if (maxSymbolValue == 0) {
    maxSymbolValue_local = 0xff;
  }
  local_38 = (BYTE *)((long)dst + dstSize);
  uVar4 = 0xb;
  if (huffLog != 0) {
    uVar4 = huffLog;
  }
  if ((repeat != (HUF_repeat *)0x0 && preferRepeat != 0) && (*repeat == HUF_repeat_valid)) {
    sVar5 = HUF_compressCTable_internal
                      ((BYTE *)dst,(BYTE *)dst,local_38,src,srcSize,nbStreams,oldHufTable,bmi2);
    return sVar5;
  }
  local_48 = CONCAT71(local_48._1_7_,repeat == (HUF_repeat *)0x0 || preferRepeat == 0);
  local_40 = (HUF_CElt *)CONCAT44(local_40._4_4_,uVar4);
  sVar5 = HIST_count_wksp((uint *)workSpace,&maxSymbolValue_local,src,srcSize,workSpace,wkspSize);
  if (0xffffffffffffff88 < sVar5) {
    return sVar5;
  }
  if (sVar5 == srcSize) {
    *(undefined1 *)dst = *src;
    return 1;
  }
  if (sVar5 <= (srcSize >> 7) + 4) {
    return 0;
  }
  pHVar10 = oldHufTable;
  pBVar9 = (BYTE *)dst;
  if (repeat != (HUF_repeat *)0x0) {
    HVar3 = *repeat;
    if (HVar3 == HUF_repeat_check) {
      uVar4 = 0xffffffff;
      if (-1 < (int)maxSymbolValue_local) {
        uVar4 = maxSymbolValue_local;
      }
      bVar2 = false;
      for (lVar8 = 0; (long)(int)uVar4 + 1 != lVar8; lVar8 = lVar8 + 1) {
        bVar2 = (bool)(bVar2 | (oldHufTable[lVar8].nbBits == '\0' &&
                               *(int *)((long)workSpace + lVar8 * 4) != 0));
      }
      bVar1 = (byte)local_48;
      if (bVar2) {
        *repeat = HUF_repeat_none;
        HVar3 = HUF_repeat_none;
        goto LAB_0012b8be;
      }
    }
    else {
LAB_0012b8be:
      bVar1 = (byte)local_48 | HVar3 == HUF_repeat_none;
      local_48 = CONCAT71(local_48._1_7_,bVar1);
    }
    if (bVar1 == 0) goto LAB_0012b9e3;
  }
  uVar4 = HUF_optimalTableLog((uint)local_40,srcSize,maxSymbolValue_local);
  local_40 = (HUF_CElt *)((long)workSpace + 0x400);
  local_48 = (ulong)maxSymbolValue_local;
  sVar5 = HUF_buildCTable_wksp
                    (local_40,(uint *)workSpace,maxSymbolValue_local,uVar4,
                     (void *)((long)workSpace + 0x800),0x1000);
  if (0xffffffffffffff88 < sVar5) {
    return sVar5;
  }
  uVar6 = (ulong)((int)local_48 + 1);
  memset(local_40 + uVar6,0,uVar6 * -4 + 0x400);
  sVar5 = HUF_writeCTable(dst,dstSize,local_40,(uint)local_48,(uint)sVar5);
  uVar4 = maxSymbolValue_local;
  if (0xffffffffffffff88 < sVar5) {
    return sVar5;
  }
  if (repeat == (HUF_repeat *)0x0) {
    if (srcSize <= sVar5 + 0xc) {
      return 0;
    }
  }
  else {
    if (*repeat != HUF_repeat_none) {
      local_48 = HUF_estimateCompressedSize(oldHufTable,(uint *)workSpace,maxSymbolValue_local);
      sVar7 = HUF_estimateCompressedSize(local_40,(uint *)workSpace,uVar4);
      if ((srcSize <= sVar5 + 0xc) || (local_48 <= sVar7 + sVar5)) goto LAB_0012b9e3;
    }
    if (srcSize <= sVar5 + 0xc) {
      return 0;
    }
    *repeat = HUF_repeat_none;
  }
  pHVar10 = local_40;
  pBVar9 = (BYTE *)(sVar5 + (long)dst);
  if (oldHufTable != (HUF_CElt *)0x0) {
    memcpy(oldHufTable,local_40,0x400);
  }
LAB_0012b9e3:
  sVar5 = HUF_compressCTable_internal
                    ((BYTE *)dst,pBVar9,local_38,src,srcSize,nbStreams,pHVar10,bmi2);
  return sVar5;
}

Assistant:

static size_t
HUF_compress_internal (void* dst, size_t dstSize,
                 const void* src, size_t srcSize,
                       unsigned maxSymbolValue, unsigned huffLog,
                       HUF_nbStreams_e nbStreams,
                       void* workSpace, size_t wkspSize,
                       HUF_CElt* oldHufTable, HUF_repeat* repeat, int preferRepeat,
                 const int bmi2)
{
    HUF_compress_tables_t* const table = (HUF_compress_tables_t*)workSpace;
    BYTE* const ostart = (BYTE*)dst;
    BYTE* const oend = ostart + dstSize;
    BYTE* op = ostart;

    /* checks & inits */
    if (((size_t)workSpace & 3) != 0) return ERROR(GENERIC);  /* must be aligned on 4-bytes boundaries */
    if (wkspSize < HUF_WORKSPACE_SIZE) return ERROR(workSpace_tooSmall);
    if (!srcSize) return 0;  /* Uncompressed */
    if (!dstSize) return 0;  /* cannot fit anything within dst budget */
    if (srcSize > HUF_BLOCKSIZE_MAX) return ERROR(srcSize_wrong);   /* current block size limit */
    if (huffLog > HUF_TABLELOG_MAX) return ERROR(tableLog_tooLarge);
    if (maxSymbolValue > HUF_SYMBOLVALUE_MAX) return ERROR(maxSymbolValue_tooLarge);
    if (!maxSymbolValue) maxSymbolValue = HUF_SYMBOLVALUE_MAX;
    if (!huffLog) huffLog = HUF_TABLELOG_DEFAULT;

    /* Heuristic : If old table is valid, use it for small inputs */
    if (preferRepeat && repeat && *repeat == HUF_repeat_valid) {
        return HUF_compressCTable_internal(ostart, op, oend,
                                           src, srcSize,
                                           nbStreams, oldHufTable, bmi2);
    }

    /* Scan input and build symbol stats */
    {   CHECK_V_F(largest, HIST_count_wksp (table->count, &maxSymbolValue, (const BYTE*)src, srcSize, workSpace, wkspSize) );
        if (largest == srcSize) { *ostart = ((const BYTE*)src)[0]; return 1; }   /* single symbol, rle */
        if (largest <= (srcSize >> 7)+4) return 0;   /* heuristic : probably not compressible enough */
    }

    /* Check validity of previous table */
    if ( repeat
      && *repeat == HUF_repeat_check
      && !HUF_validateCTable(oldHufTable, table->count, maxSymbolValue)) {
        *repeat = HUF_repeat_none;
    }
    /* Heuristic : use existing table for small inputs */
    if (preferRepeat && repeat && *repeat != HUF_repeat_none) {
        return HUF_compressCTable_internal(ostart, op, oend,
                                           src, srcSize,
                                           nbStreams, oldHufTable, bmi2);
    }

    /* Build Huffman Tree */
    huffLog = HUF_optimalTableLog(huffLog, srcSize, maxSymbolValue);
    {   size_t const maxBits = HUF_buildCTable_wksp(table->CTable, table->count,
                                            maxSymbolValue, huffLog,
                                            table->nodeTable, sizeof(table->nodeTable));
        CHECK_F(maxBits);
        huffLog = (U32)maxBits;
        /* Zero unused symbols in CTable, so we can check it for validity */
        memset(table->CTable + (maxSymbolValue + 1), 0,
               sizeof(table->CTable) - ((maxSymbolValue + 1) * sizeof(HUF_CElt)));
    }

    /* Write table description header */
    {   CHECK_V_F(hSize, HUF_writeCTable (op, dstSize, table->CTable, maxSymbolValue, huffLog) );
        /* Check if using previous huffman table is beneficial */
        if (repeat && *repeat != HUF_repeat_none) {
            size_t const oldSize = HUF_estimateCompressedSize(oldHufTable, table->count, maxSymbolValue);
            size_t const newSize = HUF_estimateCompressedSize(table->CTable, table->count, maxSymbolValue);
            if (oldSize <= hSize + newSize || hSize + 12 >= srcSize) {
                return HUF_compressCTable_internal(ostart, op, oend,
                                                   src, srcSize,
                                                   nbStreams, oldHufTable, bmi2);
        }   }

        /* Use the new huffman table */
        if (hSize + 12ul >= srcSize) { return 0; }
        op += hSize;
        if (repeat) { *repeat = HUF_repeat_none; }
        if (oldHufTable)
            memcpy(oldHufTable, table->CTable, sizeof(table->CTable));  /* Save new table */
    }
    return HUF_compressCTable_internal(ostart, op, oend,
                                       src, srcSize,
                                       nbStreams, table->CTable, bmi2);
}